

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisDecodeOperandRegister
          (ZydisDecodedInstruction *instruction,ZydisDecodedOperand *operand,
          ZydisRegisterClass register_class,ZyanU8 register_id)

{
  ZydisMemoryOperandType ZVar1;
  ZydisMemoryOperandType ZVar2;
  
  if (operand == (ZydisDecodedOperand *)0x0) {
    __assert_fail("operand",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4c6,
                  "ZyanStatus ZydisDecodeOperandRegister(const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass, ZyanU8)"
                 );
  }
  operand->type = ZYDIS_OPERAND_TYPE_REGISTER;
  if (register_class == ZYDIS_REGCLASS_GPR8) {
    ZVar1 = ((uint)instruction->attributes & 4) + ZYDIS_MEMOP_TYPE_MEM;
    ZVar2 = ZYDIS_MEMOP_TYPE_MEM;
    if (3 < register_id) {
      ZVar2 = ZVar1;
    }
    (operand->field_10).mem.type = ZVar2 + register_id;
  }
  else {
    ZVar1 = ZydisRegisterEncode(register_class,register_id);
    (operand->field_10).mem.type = ZVar1;
    if (ZVar1 == ZYDIS_MEMOP_TYPE_INVALID) {
      __assert_fail("operand->reg.value",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x4d6,
                    "ZyanStatus ZydisDecodeOperandRegister(const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass, ZyanU8)"
                   );
    }
  }
  return ZVar1;
}

Assistant:

static ZyanStatus ZydisDecodeOperandRegister(const ZydisDecodedInstruction* instruction,
    ZydisDecodedOperand* operand, ZydisRegisterClass register_class, ZyanU8 register_id)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(operand);

    operand->type = ZYDIS_OPERAND_TYPE_REGISTER;

    if (register_class == ZYDIS_REGCLASS_GPR8)
    {
        if ((instruction->attributes & ZYDIS_ATTRIB_HAS_REX) && (register_id >= 4))
        {
            operand->reg.value = ZYDIS_REGISTER_SPL + (register_id - 4);
        } else
        {
            operand->reg.value = ZYDIS_REGISTER_AL + register_id;
        }
    } else
    {
        operand->reg.value = ZydisRegisterEncode(register_class, register_id);
        ZYAN_ASSERT(operand->reg.value);
        /*if (!operand->reg.value)
        {
            return ZYAN_STATUS_BAD_REGISTER;
        }*/
    }

    return ZYAN_STATUS_SUCCESS;
}